

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int ctr_drbg_update_internal(mbedtls_ctr_drbg_context *ctx,uchar *data)

{
  uchar uVar1;
  int local_58;
  int local_54;
  int j;
  int i;
  uchar *p;
  uchar tmp [48];
  uchar *data_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  _j = &p;
  tmp._40_8_ = data;
  memset(&p,0,0x30);
  for (local_58 = 0; local_58 < 0x30; local_58 = local_58 + 0x10) {
    local_54 = 0x10;
    while ((0 < local_54 &&
           (uVar1 = ctx->counter[local_54 + -1] + '\x01', ctx->counter[local_54 + -1] = uVar1,
           uVar1 == '\0'))) {
      local_54 = local_54 + -1;
    }
    mbedtls_aes_crypt_ecb(&ctx->aes_ctx,1,ctx->counter,(uchar *)_j);
    _j = _j + 2;
  }
  for (local_54 = 0; local_54 < 0x30; local_54 = local_54 + 1) {
    tmp[(long)local_54 + -8] = tmp[(long)local_54 + -8] ^ *(byte *)(tmp._40_8_ + (long)local_54);
  }
  mbedtls_aes_setkey_enc(&ctx->aes_ctx,(uchar *)&p,0x100);
  *(undefined8 *)ctx->counter = tmp._24_8_;
  *(undefined8 *)(ctx->counter + 8) = tmp._32_8_;
  return 0;
}

Assistant:

static int ctr_drbg_update_internal( mbedtls_ctr_drbg_context *ctx,
                              const unsigned char data[MBEDTLS_CTR_DRBG_SEEDLEN] )
{
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = tmp;
    int i, j;

    memset( tmp, 0, MBEDTLS_CTR_DRBG_SEEDLEN );

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        /*
         * Increase counter
         */
        for( i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i-- )
            if( ++ctx->counter[i - 1] != 0 )
                break;

        /*
         * Crypt counter block
         */
        mbedtls_aes_crypt_ecb( &ctx->aes_ctx, MBEDTLS_AES_ENCRYPT, ctx->counter, p );

        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    for( i = 0; i < MBEDTLS_CTR_DRBG_SEEDLEN; i++ )
        tmp[i] ^= data[i];

    /*
     * Update key and counter
     */
    mbedtls_aes_setkey_enc( &ctx->aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS );
    memcpy( ctx->counter, tmp + MBEDTLS_CTR_DRBG_KEYSIZE, MBEDTLS_CTR_DRBG_BLOCKSIZE );

    return( 0 );
}